

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O0

void ssl_write_alpn_ext(mbedtls_ssl_context *ssl,uchar *buf,size_t *olen)

{
  uchar *puVar1;
  size_t sVar2;
  char **local_40;
  char **cur;
  size_t alpnlen;
  uchar *end;
  uchar *p;
  size_t *olen_local;
  uchar *buf_local;
  mbedtls_ssl_context *ssl_local;
  
  puVar1 = ssl->out_msg;
  cur = (char **)0x0;
  *olen = 0;
  if (ssl->conf->alpn_list != (char **)0x0) {
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
               ,0x26c,"client hello, adding alpn extension");
    for (local_40 = ssl->conf->alpn_list; *local_40 != (char *)0x0; local_40 = local_40 + 1) {
      sVar2 = strlen(*local_40);
      cur = (char **)((long)(int)((byte)sVar2 + 1) + (long)cur);
    }
    if ((puVar1 + 0x4000 < buf) || ((ulong)((long)(puVar1 + 0x4000) - (long)buf) < (long)cur + 6U))
    {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                 ,0x273,"buffer too small");
    }
    else {
      *buf = '\0';
      buf[1] = '\x10';
      end = buf + 6;
      for (local_40 = ssl->conf->alpn_list; *local_40 != (char *)0x0; local_40 = local_40 + 1) {
        sVar2 = strlen(*local_40);
        *end = (uchar)sVar2;
        memcpy(end + 1,*local_40,(ulong)*end);
        end = end + (int)(*end + 1);
      }
      *olen = (long)end - (long)buf;
      buf[4] = (uchar)(*olen - 6 >> 8);
      buf[5] = (char)*olen + 0xfa;
      buf[2] = (uchar)(*olen - 4 >> 8);
      buf[3] = (char)*olen + 0xfc;
    }
  }
  return;
}

Assistant:

static void ssl_write_alpn_ext( mbedtls_ssl_context *ssl,
                                unsigned char *buf, size_t *olen )
{
    if( ssl->alpn_chosen == NULL )
    {
        *olen = 0;
        return;
    }

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "server hello, adding alpn extension" ) );

    /*
     * 0 . 1    ext identifier
     * 2 . 3    ext length
     * 4 . 5    protocol list length
     * 6 . 6    protocol name length
     * 7 . 7+n  protocol name
     */
    buf[0] = (unsigned char)( ( MBEDTLS_TLS_EXT_ALPN >> 8 ) & 0xFF );
    buf[1] = (unsigned char)( ( MBEDTLS_TLS_EXT_ALPN      ) & 0xFF );

    *olen = 7 + strlen( ssl->alpn_chosen );

    buf[2] = (unsigned char)( ( ( *olen - 4 ) >> 8 ) & 0xFF );
    buf[3] = (unsigned char)( ( ( *olen - 4 )      ) & 0xFF );

    buf[4] = (unsigned char)( ( ( *olen - 6 ) >> 8 ) & 0xFF );
    buf[5] = (unsigned char)( ( ( *olen - 6 )      ) & 0xFF );

    buf[6] = (unsigned char)( ( ( *olen - 7 )      ) & 0xFF );

    memcpy( buf + 7, ssl->alpn_chosen, *olen - 7 );
}